

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  RepeatedField<int> *this_01;
  int iVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_01 = (pEVar1->field_0).repeated_int32_value;
  }
  else {
    pEVar1->type = type;
    pEVar1->is_repeated = true;
    pEVar1->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      this_01 = (RepeatedField<int> *)operator_new(0x10);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = (void *)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      }
      this_01 = (RepeatedField<int> *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&this_00->impl_,0x10,
                           arena_destruct_object<google::protobuf::RepeatedField<int>>);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->arena_or_elements_ = this_00;
    }
    (pEVar1->field_0).repeated_int32_value = this_01;
  }
  iVar2 = this_01->current_size_;
  if (iVar2 == this_01->total_size_) {
    RepeatedField<int>::Reserve(this_01,iVar2 + 1);
    iVar2 = this_01->current_size_;
  }
  this_01->current_size_ = iVar2 + 1;
  *(int *)((long)this_01->arena_or_elements_ + (long)iVar2 * 4) = value;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}